

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

bool check_sidestep(CHAR_DATA *ch,CHAR_DATA *victim,int skill,int mod)

{
  bool bVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  CHAR_DATA *in_RSI;
  char type [4608];
  int chance;
  undefined4 in_stack_ffffffffffffedd8;
  int in_stack_ffffffffffffeddc;
  int in_stack_ffffffffffffede0;
  int in_stack_ffffffffffffede4;
  undefined4 in_stack_ffffffffffffede8;
  int in_stack_ffffffffffffedec;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  int in_stack_ffffffffffffeedc;
  CHAR_DATA *in_stack_ffffffffffffeee0;
  int local_24;
  bool local_1;
  
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
  if ((bVar1) ||
     ((bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8)),
      bVar1 && (bVar1 = is_affected_by((CHAR_DATA *)
                                       CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8)
                                       ,in_stack_ffffffffffffede4), bVar1)))) {
    local_1 = false;
  }
  else {
    bVar1 = style_check(in_stack_ffffffffffffede0,in_stack_ffffffffffffeddc);
    if (bVar1) {
      if (in_EDX == 0) {
        iVar2 = get_skill(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc);
        if (iVar2 < 2) {
          return false;
        }
        sprintf(&stack0xffffffffffffedd8,"attack");
        local_24 = in_ECX;
      }
      else {
        iVar2 = get_skill(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc);
        if (iVar2 < 2) {
          return false;
        }
        sprintf(&stack0xffffffffffffedd8,"%s",skill_table[in_EDX].name);
        local_24 = (int)((float)iVar2 * ((float)in_ECX / 100.0));
      }
      if (in_RSI->fighting == (CHAR_DATA *)0x0) {
        bVar1 = can_see(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
        if (bVar1) {
          bVar1 = is_affected_by((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8),
                                 in_stack_ffffffffffffede4);
          if (bVar1) {
            local_1 = false;
          }
          else {
            bVar1 = is_affected(in_RSI,(int)gsn_hold_person);
            if (bVar1) {
              local_1 = false;
            }
            else {
              bVar1 = is_awake(in_RSI);
              if (bVar1) {
                if (in_RSI->pcdata->energy_state < -4) {
                  local_1 = false;
                }
                else {
                  bVar1 = is_affected(in_RSI,(int)gsn_bind_feet);
                  if (bVar1) {
                    local_1 = false;
                  }
                  else {
                    bVar1 = is_affected(in_RSI,(int)gsn_creeping_tomb);
                    if (bVar1) {
                      local_1 = false;
                    }
                    else {
                      iVar2 = number_percent();
                      if (iVar2 < local_24) {
                        act((char *)in_stack_ffffffffffffedf0,
                            (CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8),
                            (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                            (void *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8),0)
                        ;
                        act((char *)in_stack_ffffffffffffedf0,
                            (CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8),
                            (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                            (void *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8),0)
                        ;
                        WAIT_STATE(in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
                        local_1 = true;
                      }
                      else {
                        act((char *)in_stack_ffffffffffffedf0,
                            (CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8),
                            (void *)CONCAT44(in_stack_ffffffffffffede4,in_stack_ffffffffffffede0),
                            (void *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8),0)
                        ;
                        local_1 = false;
                      }
                    }
                  }
                }
              }
              else {
                local_1 = false;
              }
            }
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool check_sidestep(CHAR_DATA *ch, CHAR_DATA *victim, int skill, int mod)
{
	int chance;
	char type[MSL];

	if (is_npc(victim) || (is_npc(ch) && is_affected_by(ch, AFF_CHARM)))
		return false;

	if (!style_check(gsn_sidestep, victim->pcdata->style))
		return false;

	if (skill == 0)
	{
		if (get_skill(victim, gsn_sidestep) < 2)
			return false;

		chance = mod;
		sprintf(type, "attack");
	}
	else
	{
		chance = get_skill(victim, gsn_sidestep);

		if (chance < 2)
			return false;

		sprintf(type, "%s", skill_table[skill].name);
		chance = (int)(chance * ((float)mod / 100));
	}

	if (victim->fighting)
		return false;

	if (!can_see(victim, ch))
		return false;

	if (is_affected_by(ch, AFF_HIDE))
		return false;

	if (is_affected(victim, gsn_hold_person))
		return false;

	if (!is_awake(victim))
		return false;

	if (victim->pcdata->energy_state < -4)
		return false;

	if (is_affected(victim, gsn_bind_feet))
		return false;

	if (is_affected(victim, gsn_creeping_tomb))
		return false;

	if (number_percent() < chance)
	{
		act("Anticipating the coming strike, $N deftly sidesteps your $t.", ch, type, victim, TO_CHAR);
		act("Anticipating the coming strike, you deftly sidestep $n's $t.", ch, type, victim, TO_VICT);

		WAIT_STATE(ch, PULSE_VIOLENCE * 2);
		return true;
	}
	else
	{
		act("You notice $n bearing down on you too late, and fail to sidestep his $t.", ch, type, victim, TO_VICT);
	}

	return false;
}